

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joint.cpp
# Opt level: O0

void __thiscall
CMU462::DynamicScene::Joint::drag
          (Joint *this,double x,double y,double dx,double dy,Matrix4x4 *modelViewProj)

{
  Vector3D local_478;
  Vector3D local_460;
  Matrix4x4 local_448;
  Vector4D local_3c8;
  Matrix4x4 local_3a8;
  Matrix4x4 local_328;
  Matrix4x4 local_2a8;
  Matrix4x4 local_228;
  Joint *local_1a8;
  Joint *j;
  Matrix4x4 T;
  Vector4D local_a0;
  double local_80;
  double w;
  double local_70;
  double local_68;
  double local_60;
  undefined1 local_58 [8];
  Vector4D q;
  Matrix4x4 *modelViewProj_local;
  double dy_local;
  double dx_local;
  double y_local;
  double x_local;
  Joint *this_local;
  
  q.w = (double)modelViewProj;
  Vector4D::Vector4D((Vector4D *)local_58,&(this->super_SceneObject).position,1.0);
  Matrix4x4::operator*((Vector4D *)&w,(Matrix4x4 *)q.w,(Vector4D *)local_58);
  local_58 = (undefined1  [8])w;
  q.x = local_70;
  q.y = local_68;
  q.z = local_60;
  local_80 = local_60;
  Vector4D::operator/=((Vector4D *)local_58,&local_80);
  local_58 = (undefined1  [8])(dx + (double)local_58);
  q.x = dy + q.x;
  Vector4D::operator*=((Vector4D *)local_58,&local_80);
  Matrix4x4::inv((Matrix4x4 *)&T.entries[3].w,(Matrix4x4 *)q.w);
  Matrix4x4::operator*(&local_a0,(Matrix4x4 *)&T.entries[3].w,(Vector4D *)local_58);
  local_58 = (undefined1  [8])local_a0.x;
  q.x = local_a0.y;
  q.y = local_a0.z;
  q.z = local_a0.w;
  Matrix4x4::identity();
  for (local_1a8 = this; local_1a8 != (Joint *)0x0; local_1a8 = local_1a8->parent) {
    (*(local_1a8->super_SceneObject)._vptr_SceneObject[0xc])(&local_2a8);
    Matrix4x4::operator*(&local_228,&local_2a8,(Matrix4x4 *)&j);
    memcpy(&j,&local_228,0x80);
  }
  (*(this->skeleton->mesh->super_SceneObject)._vptr_SceneObject[0xc])(&local_3a8);
  Matrix4x4::operator*(&local_328,&local_3a8,(Matrix4x4 *)&j);
  memcpy(&j,&local_328,0x80);
  Matrix4x4::inv(&local_448,(Matrix4x4 *)&j);
  Matrix4x4::operator*(&local_3c8,&local_448,(Vector4D *)local_58);
  local_58 = (undefined1  [8])local_3c8.x;
  q.x = local_3c8.y;
  q.y = local_3c8.z;
  q.z = local_3c8.w;
  if (this->skeleton->root == this) {
    Vector4D::to3D(&local_460,(Vector4D *)local_58);
    (this->super_SceneObject).position.x = local_460.x;
    (this->super_SceneObject).position.y = local_460.y;
    (this->super_SceneObject).position.z = local_460.z;
  }
  else {
    Vector4D::to3D(&local_478,(Vector4D *)local_58);
    Vector3D::operator+=(&this->axis,&local_478);
  }
  return;
}

Assistant:

void Joint::drag(double x, double y, double dx, double dy, const Matrix4x4& modelViewProj)
   {
      Vector4D q(position, 1.);

      // Transform into clip space
      q = modelViewProj * q;
      double w = q.w;
      q /= w;

      // Shift by (dx, dy).
      q.x += dx;
      q.y += dy;

      // Transform back into model space
      q *= w;
      q = modelViewProj.inv() * q;

      Matrix4x4 T = Matrix4x4::identity();
      for (Joint* j = this; j != nullptr; j = j->parent)
      {
          T = j->getRotation() * T;
      }
      T = skeleton->mesh->getRotation() * T;
      q = T.inv() * q;

      if (skeleton->root == this)
         position = q.to3D();
      else
         axis += q.to3D();
   }